

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http1.c
# Opt level: O2

ssize_t Curl_h1_req_parse_read
                  (h1_req_parser *parser,char *buf,size_t buflen,char *scheme_default,int options,
                  CURLcode *err)

{
  dynbuf *s;
  char *__src;
  long lVar1;
  char cVar2;
  CURLcode CVar3;
  int iVar4;
  CURLUcode CVar5;
  void *pvVar6;
  size_t sVar7;
  char *pcVar8;
  size_t sVar9;
  char *p_len;
  size_t sVar10;
  ssize_t sVar11;
  char *__n;
  ulong __n_00;
  CURLU *u;
  char *authority;
  long lVar12;
  long lVar13;
  char *path;
  char *local_2080;
  undefined8 local_2040;
  char local_2038 [8200];
  
  *err = CURLE_OK;
  s = &parser->scratch;
  lVar12 = 0;
  local_2040 = err;
LAB_00137a96:
  do {
    if ((parser->field_0x48 & 1) != 0) {
      return lVar12;
    }
    if (parser->line != (char *)0x0) {
      parser->line = (char *)0x0;
      parser->line_len = 0;
      Curl_dyn_reset(s);
    }
    pvVar6 = memchr(buf,10,buflen);
    if (pvVar6 == (void *)0x0) {
      *err = CURLE_AGAIN;
      CVar3 = Curl_dyn_addn(s,buf,buflen);
      *err = CVar3;
      if ((CVar3 != CURLE_OK) || (sVar10 = buflen, (long)buflen < 0)) {
LAB_00137e8e:
        sVar11 = -1;
        if (CVar3 == CURLE_AGAIN) {
          sVar11 = lVar12;
        }
        goto LAB_00137e98;
      }
    }
    else {
      parser->line = buf;
      sVar10 = ((long)pvVar6 - (long)buf) + 1;
      parser->line_len = sVar10;
      *err = CURLE_OK;
      if ((long)pvVar6 - (long)buf < -1) {
LAB_00137e7e:
        sVar11 = -1;
LAB_00137e98:
        *err = CURLE_OK;
        return sVar11;
      }
      sVar7 = Curl_dyn_len(s);
      sVar9 = parser->line_len;
      if (sVar7 != 0) {
        CVar3 = Curl_dyn_addn(s,parser->line,sVar9);
        *err = CVar3;
        if (CVar3 != CURLE_OK) goto LAB_00137e8e;
        pcVar8 = Curl_dyn_ptr(s);
        parser->line = pcVar8;
        sVar9 = Curl_dyn_len(s);
        parser->line_len = sVar9;
      }
      if (sVar9 == 0) {
joined_r0x00137baa:
        if ((options & 1U) != 0) goto LAB_00137e7e;
      }
      else {
        cVar2 = parser->line[sVar9 - 1];
        sVar7 = sVar9;
        if (cVar2 == '\n') {
          sVar7 = sVar9 - 1;
          parser->line_len = sVar7;
          if (sVar7 == 0) goto joined_r0x00137baa;
          cVar2 = parser->line[sVar9 - 2];
        }
        if (cVar2 == '\r') {
          sVar7 = sVar7 - 1;
          parser->line_len = sVar7;
        }
        else if ((options & 1U) != 0) goto LAB_00137e7e;
        if (parser->max_line_len < sVar7) goto LAB_00137e7e;
      }
      *err = CURLE_OK;
    }
    lVar12 = lVar12 + sVar10;
    buf = buf + sVar10;
    buflen = buflen - sVar10;
    pcVar8 = parser->line;
    if (pcVar8 == (char *)0x0) {
      if (buflen == 0) {
        return lVar12;
      }
      goto LAB_00137a96;
    }
    sVar10 = parser->line_len;
    if (parser->req == (httpreq *)0x0) {
      pvVar6 = memchr(pcVar8,0x20,sVar10);
      __n_00 = (long)pvVar6 - (long)pcVar8;
      if (__n_00 != 0 && pvVar6 != (void *)0x0) {
        __src = (char *)((long)pvVar6 + 1);
        for (lVar13 = 0; __n_00 < sVar10 + lVar13; lVar13 = lVar13 + -1) {
          if (pcVar8[lVar13 + sVar10] == ' ') {
            if (lVar13 != 0) {
              lVar1 = sVar10 - (long)pvVar6;
              __n = pcVar8 + lVar13 + lVar1 + -1;
              u = (CURLU *)0x0;
              CVar3 = CURLE_URL_MALFORMAT;
              if (__n == (char *)0x0) goto LAB_00137c6a;
              if ((pcVar8 + lVar13 + lVar1 == (char *)0x2) && (*__src == '*')) {
                __n = (char *)0x1;
LAB_00137d69:
                local_2080 = (char *)0x0;
                p_len = __n;
                authority = (char *)0x0;
                path = __src;
LAB_00137d82:
                if (scheme_default == (char *)0x0) {
                  sVar10 = 0;
                }
                else {
                  sVar10 = strlen(scheme_default);
                }
                CVar3 = Curl_http_req_make(&parser->req,pcVar8,__n_00,scheme_default,sVar10,
                                           authority,(size_t)local_2080,path,(size_t)p_len);
              }
              else {
                iVar4 = strncmp("CONNECT",pcVar8,__n_00);
                if (iVar4 == 0) {
                  p_len = (char *)0x0;
                  path = (char *)0x0;
                  authority = __src;
                  local_2080 = __n;
                  goto LAB_00137d82;
                }
                if (*__src == '/') goto LAB_00137d69;
                CVar3 = CURLE_URL_MALFORMAT;
                if (__n < (char *)0x2000) {
                  memcpy(local_2038,__src,(size_t)__n);
                  pcVar8[(long)(local_2038 + lVar13 + lVar1 + -1)] = '\0';
                  sVar9 = Curl_is_absolute_url(local_2038,(char *)0x0,0,false);
                  if (sVar9 == 0) {
                    CVar3 = CURLE_URL_MALFORMAT;
                    if ((options & 1U) == 0) goto LAB_00137d69;
                  }
                  else {
                    u = curl_url();
                    CVar3 = CURLE_OUT_OF_MEMORY;
                    if (u != (CURLU *)0x0) {
                      CVar5 = curl_url_set(u,CURLUPART_URL,local_2038,
                                           (uint)((options & 1U) == 0) << 0xb | 0x1a);
                      if (CVar5 == CURLUE_OK) {
                        CVar3 = Curl_http_req_make2(&parser->req,pcVar8,__n_00,u,scheme_default);
                      }
                      else {
                        CVar3 = CURLE_URL_MALFORMAT;
                      }
                      goto LAB_00137c6a;
                    }
                  }
                }
              }
              u = (CURLU *)0x0;
              goto LAB_00137c6a;
            }
            break;
          }
        }
      }
      u = (CURLU *)0x0;
      CVar3 = CURLE_URL_MALFORMAT;
LAB_00137c6a:
      curl_url_cleanup(u);
      *local_2040 = CVar3;
      err = local_2040;
    }
    else {
      if (sVar10 == 0) {
        parser->field_0x48 = parser->field_0x48 | 1;
        Curl_dyn_reset(s);
        goto LAB_00137a96;
      }
      CVar3 = Curl_dynhds_h1_add_line(&parser->req->headers,pcVar8,sVar10);
      *err = CVar3;
    }
    if (CVar3 != CURLE_OK) {
      return -1;
    }
  } while( true );
}

Assistant:

ssize_t Curl_h1_req_parse_read(struct h1_req_parser *parser,
                               const char *buf, size_t buflen,
                               const char *scheme_default, int options,
                               CURLcode *err)
{
  ssize_t nread = 0, n;

  *err = CURLE_OK;
  while(!parser->done) {
    n = next_line(parser, buf, buflen, options, err);
    if(n < 0) {
      if(*err != CURLE_AGAIN) {
        nread = -1;
      }
      *err = CURLE_OK;
      goto out;
    }

    /* Consume this line */
    nread += (size_t)n;
    buf += (size_t)n;
    buflen -= (size_t)n;

    if(!parser->line) {
      /* consumed bytes, but line not complete */
      if(!buflen)
        goto out;
    }
    else if(!parser->req) {
      *err = start_req(parser, scheme_default, options);
      if(*err) {
        nread = -1;
        goto out;
      }
    }
    else if(parser->line_len == 0) {
      /* last, empty line, we are finished */
      if(!parser->req) {
        *err = CURLE_URL_MALFORMAT;
        nread = -1;
        goto out;
      }
      parser->done = TRUE;
      Curl_dyn_reset(&parser->scratch);
      /* last chance adjustments */
    }
    else {
      *err = Curl_dynhds_h1_add_line(&parser->req->headers,
                                     parser->line, parser->line_len);
      if(*err) {
        nread = -1;
        goto out;
      }
    }
  }

out:
  return nread;
}